

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_memory_semantics.cpp
# Opt level: O3

spv_result_t
spvtools::val::ValidateMemorySemantics
          (ValidationState_t *_,Instruction *inst,uint32_t operand_index,uint32_t memory_scope)

{
  CapabilitySet *this;
  undefined4 uVar1;
  bool bVar2;
  uint uVar3;
  Op OVar4;
  int32_t iVar5;
  MemoryModel MVar6;
  DiagnosticStream *pDVar7;
  long lVar8;
  char *pcVar9;
  uint uVar10;
  string local_238;
  char *local_218;
  uint32_t local_20c;
  undefined1 local_208 [5];
  char local_203;
  spv_result_t local_38;
  
  OVar4 = (Op)(inst->inst_).opcode;
  local_20c = memory_scope;
  uVar3 = Instruction::GetOperandAs<unsigned_int_const>(inst,(ulong)operand_index);
  ValidationState_t::EvalInt32IfConst((tuple<bool,_bool,_unsigned_int> *)local_208,_,uVar3);
  uVar1 = local_208._0_4_;
  if (local_203 == '\0') {
    ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
    local_238._M_dataplus._M_p = spvOpcodeString(OVar4);
    pDVar7 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,(char **)&local_238);
    pcVar9 = ": expected Memory Semantics to be a 32-bit int";
    lVar8 = 0x2e;
    goto LAB_001e0687;
  }
  if (local_208[4] == false) {
    this = &_->module_capabilities_;
    bVar2 = EnumSet<spv::Capability>::contains(this,CapabilityShader);
    if ((!bVar2) ||
       (bVar2 = EnumSet<spv::Capability>::contains(this,CapabilityCooperativeMatrixNV), bVar2)) {
      bVar2 = EnumSet<spv::Capability>::contains(this,CapabilityShader);
      if (!bVar2) {
        return SPV_SUCCESS;
      }
      bVar2 = EnumSet<spv::Capability>::contains(this,CapabilityCooperativeMatrixNV);
      if (!bVar2) {
        return SPV_SUCCESS;
      }
      OVar4 = ValidationState_t::GetIdOpcode(_,uVar3);
      iVar5 = spvOpcodeIsConstant(OVar4);
      if (iVar5 != 0) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar9 = 
      "Memory Semantics must be a constant instruction when CooperativeMatrixNV capability is present"
      ;
      lVar8 = 0x5e;
    }
    else {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar9 = "Memory Semantics ids must be OpConstant when Shader capability is present";
      lVar8 = 0x49;
    }
  }
  else {
    uVar10 = 0;
    uVar3 = local_208._0_4_ & 0x1e;
    if (uVar3 != 0) {
      do {
        uVar10 = uVar10 + 1;
        uVar3 = uVar3 - 1 & uVar3;
      } while (uVar3 != 0);
      if (1 < uVar10) {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        local_238._M_dataplus._M_p = spvOpcodeString(OVar4);
        pDVar7 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,(char **)&local_238);
        pcVar9 = 
        ": Memory Semantics can have at most one of the following bits set: Acquire, Release, AcquireRelease or SequentiallyConsistent"
        ;
        lVar8 = 0x7d;
        goto LAB_001e0687;
      }
    }
    MVar6 = ValidationState_t::memory_model(_);
    if ((uVar1 & 0x10) == 0 || MVar6 != MemoryModelVulkan) {
      if ((((uint)uVar1 >> 0xd & 1) == 0) ||
         (bVar2 = EnumSet<spv::Capability>::contains
                            (&_->module_capabilities_,CapabilityVulkanMemoryModel), bVar2)) {
        if ((((uint)uVar1 >> 0xe & 1) != 0) &&
           (bVar2 = EnumSet<spv::Capability>::contains
                              (&_->module_capabilities_,CapabilityVulkanMemoryModel), !bVar2)) {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
          local_238._M_dataplus._M_p = spvOpcodeString(OVar4);
          pDVar7 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,(char **)&local_238);
          pcVar9 = ": Memory Semantics MakeVisibleKHR requires capability ";
          lVar8 = 0x36;
          goto LAB_001e09ce;
        }
        if ((((uint)uVar1 >> 0xc & 1) != 0) &&
           (bVar2 = EnumSet<spv::Capability>::contains
                              (&_->module_capabilities_,CapabilityVulkanMemoryModel), !bVar2)) {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
          local_238._M_dataplus._M_p = spvOpcodeString(OVar4);
          pDVar7 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,(char **)&local_238);
          pcVar9 = ": Memory Semantics OutputMemoryKHR requires capability ";
          lVar8 = 0x37;
          goto LAB_001e09ce;
        }
        if ((short)uVar1 < 0) {
          bVar2 = EnumSet<spv::Capability>::contains
                            (&_->module_capabilities_,CapabilityVulkanMemoryModel);
          if (!bVar2) {
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
            local_238._M_dataplus._M_p = spvOpcodeString(OVar4);
            pDVar7 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,(char **)&local_238)
            ;
            pcVar9 = ": Memory Semantics Volatile requires capability VulkanMemoryModelKHR";
            lVar8 = 0x44;
            goto LAB_001e0687;
          }
          bVar2 = spvOpcodeIsAtomicOp((uint)(inst->inst_).opcode);
          if (!bVar2) {
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar9 = "Memory Semantics Volatile can only be used with atomic instructions";
            lVar8 = 0x43;
            goto LAB_001e0886;
          }
        }
        if (((uVar1 & 0x40) == 0) ||
           (bVar2 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityShader),
           bVar2)) {
          if ((uVar1 & 0x1fc0) == 0 && (uVar1 & 0x6000) != 0) {
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
            local_238._M_dataplus._M_p = spvOpcodeString(OVar4);
            pDVar7 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,(char **)&local_238)
            ;
            pcVar9 = ": expected Memory Semantics to include a storage class";
            lVar8 = 0x36;
          }
          else if ((uVar1 & 0x400a) == 0x4000) {
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
            local_238._M_dataplus._M_p = spvOpcodeString(OVar4);
            pDVar7 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,(char **)&local_238)
            ;
            pcVar9 = 
            ": MakeVisibleKHR Memory Semantics also requires either Acquire or AcquireRelease Memory Semantics"
            ;
            lVar8 = 0x61;
          }
          else {
            if ((uVar1 & 0x200c) != 0x2000) {
              bVar2 = spvIsVulkanEnv(_->context_->target_env);
              if (bVar2) {
                if (uVar10 == 0 && OVar4 == OpMemoryBarrier) {
                  ValidationState_t::diag
                            ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
                  ValidationState_t::VkErrorID_abi_cxx11_(&local_238,_,0x127c,(char *)0x0);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_208,local_238._M_dataplus._M_p,
                             local_238._M_string_length);
                  local_218 = spvOpcodeString(OpMemoryBarrier);
                  pDVar7 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,&local_218);
                  pcVar9 = 
                  ": Vulkan specification requires Memory Semantics to have one of the following bits set: Acquire, Release, AcquireRelease or SequentiallyConsistent"
                  ;
                  lVar8 = 0x92;
                }
                else if (OVar4 == OpMemoryBarrier || uVar10 == 0) {
                  if ((uVar1 & 0x1940) != 0 || OVar4 != OpMemoryBarrier) goto LAB_001e0cb6;
                  ValidationState_t::diag
                            ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
                  ValidationState_t::VkErrorID_abi_cxx11_(&local_238,_,0x127d,(char *)0x0);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_208,local_238._M_dataplus._M_p,
                             local_238._M_string_length);
                  local_218 = spvOpcodeString(OpMemoryBarrier);
                  pDVar7 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,&local_218);
                  pcVar9 = ": expected Memory Semantics to include a Vulkan-supported storage class"
                  ;
                  lVar8 = 0x47;
                }
                else {
                  ValidationState_t::EvalInt32IfConst
                            ((tuple<bool,_bool,_unsigned_int> *)local_208,_,local_20c);
                  if ((local_203 == '\x01') && (local_208._0_4_ == 4)) {
                    ValidationState_t::diag
                              ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
                    ValidationState_t::VkErrorID_abi_cxx11_(&local_238,_,0x1221,(char *)0x0);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_208,local_238._M_dataplus._M_p,
                               local_238._M_string_length);
                    local_218 = spvOpcodeString(OVar4);
                    pDVar7 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,&local_218);
                    pcVar9 = 
                    ": Vulkan specification requires Memory Semantics to be None if used with Invocation Memory Scope"
                    ;
                    lVar8 = 0x60;
                  }
                  else {
LAB_001e0cb6:
                    if ((OVar4 != OpControlBarrier) || ((uVar1 == 0 || ((uVar1 & 0x1940) != 0))))
                    goto LAB_001e0d3c;
                    ValidationState_t::diag
                              ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
                    ValidationState_t::VkErrorID_abi_cxx11_(&local_238,_,0x122a,(char *)0x0);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_208,local_238._M_dataplus._M_p,
                               local_238._M_string_length);
                    local_218 = spvOpcodeString(OpControlBarrier);
                    pDVar7 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,&local_218);
                    pcVar9 = 
                    ": expected Memory Semantics to include a Vulkan-supported storage class if Memory Semantics is not None"
                    ;
                    lVar8 = 0x67;
                  }
                }
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar7,pcVar9,lVar8);
                local_38 = pDVar7->error_;
              }
              else {
LAB_001e0d3c:
                if (OVar4 == OpAtomicFlagClear) {
                  if ((uVar1 & 10) != 0) {
                    ValidationState_t::diag
                              ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_208,
                               "Memory Semantics Acquire and AcquireRelease cannot be used with ",
                               0x40);
                    local_238._M_dataplus._M_p = spvOpcodeString(OpAtomicFlagClear);
                    pDVar7 = DiagnosticStream::operator<<
                                       ((DiagnosticStream *)local_208,(char **)&local_238);
                    local_38 = pDVar7->error_;
                    goto LAB_001e0899;
                  }
                }
                else if ((uVar1 & 0xc) != 0 &&
                         (operand_index == 5 && OVar4 == OpAtomicCompareExchange)) {
                  ValidationState_t::diag
                            ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
                  local_238._M_dataplus._M_p = spvOpcodeString(OpAtomicCompareExchange);
                  pDVar7 = DiagnosticStream::operator<<
                                     ((DiagnosticStream *)local_208,(char **)&local_238);
                  pcVar9 = 
                  ": Memory Semantics Release and AcquireRelease cannot be used for operand Unequal"
                  ;
                  lVar8 = 0x50;
                  goto LAB_001e0687;
                }
                bVar2 = spvIsVulkanEnv(_->context_->target_env);
                if (!bVar2) {
                  return SPV_SUCCESS;
                }
                if (OVar4 == OpAtomicStore) {
                  if ((uVar1 & 0x1a) == 0) {
                    return SPV_SUCCESS;
                  }
                  ValidationState_t::diag
                            ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
                  ValidationState_t::VkErrorID_abi_cxx11_(&local_238,_,0x127a,(char *)0x0);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_208,local_238._M_dataplus._M_p,
                             local_238._M_string_length);
                  pcVar9 = 
                  "Vulkan spec disallows OpAtomicStore with Memory Semantics Acquire, AcquireRelease and SequentiallyConsistent"
                  ;
                  lVar8 = 0x6c;
                }
                else {
                  if (OVar4 != OpAtomicLoad) {
                    return SPV_SUCCESS;
                  }
                  if ((uVar1 & 0x1c) == 0) {
                    return SPV_SUCCESS;
                  }
                  ValidationState_t::diag
                            ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
                  ValidationState_t::VkErrorID_abi_cxx11_(&local_238,_,0x127b,(char *)0x0);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_208,local_238._M_dataplus._M_p,
                             local_238._M_string_length);
                  pcVar9 = 
                  "Vulkan spec disallows OpAtomicLoad with Memory Semantics Release, AcquireRelease and SequentiallyConsistent"
                  ;
                  lVar8 = 0x6b;
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_208,pcVar9,lVar8);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_238._M_dataplus._M_p != &local_238.field_2) {
                operator_delete(local_238._M_dataplus._M_p,
                                local_238.field_2._M_allocated_capacity + 1);
              }
              goto LAB_001e0899;
            }
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
            local_238._M_dataplus._M_p = spvOpcodeString(OVar4);
            pDVar7 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,(char **)&local_238)
            ;
            pcVar9 = 
            ": MakeAvailableKHR Memory Semantics also requires either Release or AcquireRelease Memory Semantics"
            ;
            lVar8 = 99;
          }
        }
        else {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
          local_238._M_dataplus._M_p = spvOpcodeString(OVar4);
          pDVar7 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,(char **)&local_238);
          pcVar9 = ": Memory Semantics UniformMemory requires capability Shader";
          lVar8 = 0x3b;
        }
      }
      else {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        local_238._M_dataplus._M_p = spvOpcodeString(OVar4);
        pDVar7 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,(char **)&local_238);
        pcVar9 = ": Memory Semantics MakeAvailableKHR requires capability ";
        lVar8 = 0x38;
LAB_001e09ce:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar7,pcVar9,lVar8);
        pcVar9 = "VulkanMemoryModelKHR";
        lVar8 = 0x14;
      }
LAB_001e0687:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar7,pcVar9,lVar8);
      local_38 = pDVar7->error_;
      goto LAB_001e0899;
    }
    ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar9 = 
    "SequentiallyConsistent memory semantics cannot be used with the VulkanKHR memory model.";
    lVar8 = 0x57;
  }
LAB_001e0886:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar9,lVar8);
LAB_001e0899:
  DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
  return local_38;
}

Assistant:

spv_result_t ValidateMemorySemantics(ValidationState_t& _,
                                     const Instruction* inst,
                                     uint32_t operand_index,
                                     uint32_t memory_scope) {
  const spv::Op opcode = inst->opcode();
  const auto id = inst->GetOperandAs<const uint32_t>(operand_index);
  bool is_int32 = false, is_const_int32 = false;
  uint32_t value = 0;
  std::tie(is_int32, is_const_int32, value) = _.EvalInt32IfConst(id);

  if (!is_int32) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << spvOpcodeString(opcode)
           << ": expected Memory Semantics to be a 32-bit int";
  }

  if (!is_const_int32) {
    if (_.HasCapability(spv::Capability::Shader) &&
        !_.HasCapability(spv::Capability::CooperativeMatrixNV)) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Memory Semantics ids must be OpConstant when Shader "
                "capability is present";
    }

    if (_.HasCapability(spv::Capability::Shader) &&
        _.HasCapability(spv::Capability::CooperativeMatrixNV) &&
        !spvOpcodeIsConstant(_.GetIdOpcode(id))) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Memory Semantics must be a constant instruction when "
                "CooperativeMatrixNV capability is present";
    }
    return SPV_SUCCESS;
  }

  const size_t num_memory_order_set_bits = spvtools::utils::CountSetBits(
      value & uint32_t(spv::MemorySemanticsMask::Acquire |
                       spv::MemorySemanticsMask::Release |
                       spv::MemorySemanticsMask::AcquireRelease |
                       spv::MemorySemanticsMask::SequentiallyConsistent));

  if (num_memory_order_set_bits > 1) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << spvOpcodeString(opcode)
           << ": Memory Semantics can have at most one of the following "
              "bits "
              "set: Acquire, Release, AcquireRelease or "
              "SequentiallyConsistent";
  }

  if (_.memory_model() == spv::MemoryModel::VulkanKHR &&
      value & uint32_t(spv::MemorySemanticsMask::SequentiallyConsistent)) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "SequentiallyConsistent memory "
              "semantics cannot be used with "
              "the VulkanKHR memory model.";
  }

  if (value & uint32_t(spv::MemorySemanticsMask::MakeAvailableKHR) &&
      !_.HasCapability(spv::Capability::VulkanMemoryModelKHR)) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << spvOpcodeString(opcode)
           << ": Memory Semantics MakeAvailableKHR requires capability "
           << "VulkanMemoryModelKHR";
  }

  if (value & uint32_t(spv::MemorySemanticsMask::MakeVisibleKHR) &&
      !_.HasCapability(spv::Capability::VulkanMemoryModelKHR)) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << spvOpcodeString(opcode)
           << ": Memory Semantics MakeVisibleKHR requires capability "
           << "VulkanMemoryModelKHR";
  }

  if (value & uint32_t(spv::MemorySemanticsMask::OutputMemoryKHR) &&
      !_.HasCapability(spv::Capability::VulkanMemoryModelKHR)) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << spvOpcodeString(opcode)
           << ": Memory Semantics OutputMemoryKHR requires capability "
           << "VulkanMemoryModelKHR";
  }

  if (value & uint32_t(spv::MemorySemanticsMask::Volatile)) {
    if (!_.HasCapability(spv::Capability::VulkanMemoryModelKHR)) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << spvOpcodeString(opcode)
             << ": Memory Semantics Volatile requires capability "
                "VulkanMemoryModelKHR";
    }

    if (!spvOpcodeIsAtomicOp(inst->opcode())) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Memory Semantics Volatile can only be used with atomic "
                "instructions";
    }
  }

  if (value & uint32_t(spv::MemorySemanticsMask::UniformMemory) &&
      !_.HasCapability(spv::Capability::Shader)) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << spvOpcodeString(opcode)
           << ": Memory Semantics UniformMemory requires capability Shader";
  }

  // Checking for spv::Capability::AtomicStorage is intentionally not done here.
  // See https://github.com/KhronosGroup/glslang/issues/1618 for the reasoning
  // why.

  if (value & uint32_t(spv::MemorySemanticsMask::MakeAvailableKHR |
                       spv::MemorySemanticsMask::MakeVisibleKHR)) {
    const bool includes_storage_class =
        value & uint32_t(spv::MemorySemanticsMask::UniformMemory |
                         spv::MemorySemanticsMask::SubgroupMemory |
                         spv::MemorySemanticsMask::WorkgroupMemory |
                         spv::MemorySemanticsMask::CrossWorkgroupMemory |
                         spv::MemorySemanticsMask::AtomicCounterMemory |
                         spv::MemorySemanticsMask::ImageMemory |
                         spv::MemorySemanticsMask::OutputMemoryKHR);

    if (!includes_storage_class) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << spvOpcodeString(opcode)
             << ": expected Memory Semantics to include a storage class";
    }
  }

  if (value & uint32_t(spv::MemorySemanticsMask::MakeVisibleKHR) &&
      !(value & uint32_t(spv::MemorySemanticsMask::Acquire |
                         spv::MemorySemanticsMask::AcquireRelease))) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << spvOpcodeString(opcode)
           << ": MakeVisibleKHR Memory Semantics also requires either Acquire "
              "or AcquireRelease Memory Semantics";
  }

  if (value & uint32_t(spv::MemorySemanticsMask::MakeAvailableKHR) &&
      !(value & uint32_t(spv::MemorySemanticsMask::Release |
                         spv::MemorySemanticsMask::AcquireRelease))) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << spvOpcodeString(opcode)
           << ": MakeAvailableKHR Memory Semantics also requires either "
              "Release or AcquireRelease Memory Semantics";
  }

  if (spvIsVulkanEnv(_.context()->target_env)) {
    const bool includes_storage_class =
        value & uint32_t(spv::MemorySemanticsMask::UniformMemory |
                         spv::MemorySemanticsMask::WorkgroupMemory |
                         spv::MemorySemanticsMask::ImageMemory |
                         spv::MemorySemanticsMask::OutputMemoryKHR);

    if (opcode == spv::Op::OpMemoryBarrier && !num_memory_order_set_bits) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << _.VkErrorID(4732) << spvOpcodeString(opcode)
             << ": Vulkan specification requires Memory Semantics to have "
                "one "
                "of the following bits set: Acquire, Release, "
                "AcquireRelease "
                "or SequentiallyConsistent";
    } else if (opcode != spv::Op::OpMemoryBarrier &&
               num_memory_order_set_bits) {
      // should leave only atomics and control barriers for Vulkan env
      bool memory_is_int32 = false, memory_is_const_int32 = false;
      uint32_t memory_value = 0;
      std::tie(memory_is_int32, memory_is_const_int32, memory_value) =
          _.EvalInt32IfConst(memory_scope);
      if (memory_is_int32 &&
          spv::Scope(memory_value) == spv::Scope::Invocation) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << _.VkErrorID(4641) << spvOpcodeString(opcode)
               << ": Vulkan specification requires Memory Semantics to be None "
                  "if used with Invocation Memory Scope";
      }
    }

    if (opcode == spv::Op::OpMemoryBarrier && !includes_storage_class) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << _.VkErrorID(4733) << spvOpcodeString(opcode)
             << ": expected Memory Semantics to include a Vulkan-supported "
                "storage class";
    }

    if (opcode == spv::Op::OpControlBarrier && value && !includes_storage_class) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << _.VkErrorID(4650) << spvOpcodeString(opcode)
             << ": expected Memory Semantics to include a Vulkan-supported "
                "storage class if Memory Semantics is not None";
    }
  }

  if (opcode == spv::Op::OpAtomicFlagClear &&
      (value & uint32_t(spv::MemorySemanticsMask::Acquire) ||
       value & uint32_t(spv::MemorySemanticsMask::AcquireRelease))) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Memory Semantics Acquire and AcquireRelease cannot be used "
              "with "
           << spvOpcodeString(opcode);
  }

  if (opcode == spv::Op::OpAtomicCompareExchange && operand_index == 5 &&
      (value & uint32_t(spv::MemorySemanticsMask::Release) ||
       value & uint32_t(spv::MemorySemanticsMask::AcquireRelease))) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << spvOpcodeString(opcode)
           << ": Memory Semantics Release and AcquireRelease cannot be "
              "used "
              "for operand Unequal";
  }

  if (spvIsVulkanEnv(_.context()->target_env)) {
    if (opcode == spv::Op::OpAtomicLoad &&
        (value & uint32_t(spv::MemorySemanticsMask::Release) ||
         value & uint32_t(spv::MemorySemanticsMask::AcquireRelease) ||
         value & uint32_t(spv::MemorySemanticsMask::SequentiallyConsistent))) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << _.VkErrorID(4731)
             << "Vulkan spec disallows OpAtomicLoad with Memory Semantics "
                "Release, AcquireRelease and SequentiallyConsistent";
    }

    if (opcode == spv::Op::OpAtomicStore &&
        (value & uint32_t(spv::MemorySemanticsMask::Acquire) ||
         value & uint32_t(spv::MemorySemanticsMask::AcquireRelease) ||
         value & uint32_t(spv::MemorySemanticsMask::SequentiallyConsistent))) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << _.VkErrorID(4730)
             << "Vulkan spec disallows OpAtomicStore with Memory Semantics "
                "Acquire, AcquireRelease and SequentiallyConsistent";
    }
  }

  // TODO(atgoo@github.com) Add checks for OpenCL and OpenGL environments.

  return SPV_SUCCESS;
}